

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O1

void mv_bubble(level *lev,bubble *b,int dx,int dy,boolean ini)

{
  int iVar1;
  char cVar2;
  char cVar3;
  byte *pbVar4;
  container *pcVar5;
  obj *poVar6;
  monst *mtmp;
  void *pvVar7;
  bool bVar8;
  bool bVar9;
  long lVar10;
  obj *otmp;
  container *__ptr;
  uchar *puVar11;
  char cVar12;
  char cVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int x;
  uint uVar19;
  char cVar20;
  ulong uVar21;
  undefined1 *puVar22;
  long lVar23;
  bool bVar24;
  undefined1 *local_68;
  
  if (dx - 2U < 0xfffffffd || dy - 2U < 0xfffffffd) {
    dx = sgn(dx);
    dy = sgn(dy);
  }
  iVar16 = (int)b->x;
  iVar1 = xmin + 1;
  cVar2 = b->y;
  iVar18 = ymin + 1;
  bVar8 = xmax <= (int)((uint)*b->bm + iVar16);
  bVar9 = ymax <= (int)((uint)b->bm[1] + (int)cVar2);
  if (iVar16 <= xmin) {
    pline("bubble xmin: x = %d, xmin = %d");
    b->x = (char)xmin + '\x01';
  }
  if (b->y <= ymin) {
    pline("bubble ymin: y = %d, ymin = %d",(ulong)(uint)(int)b->y,(ulong)(ymin + 1));
    b->y = (char)ymin + '\x01';
  }
  iVar17 = (uint)*b->bm + (int)b->x;
  if (xmax < iVar17) {
    pline("bubble xmax: x = %d, xmax = %d",(ulong)(iVar17 - 1),(ulong)(xmax - 1));
    b->x = (char)xmax - *b->bm;
  }
  iVar17 = (uint)b->bm[1] + (int)b->y;
  if (ymax < iVar17) {
    pline("bubble ymax: y = %d, ymax = %d",(ulong)(iVar17 - 1),(ulong)(ymax - 1));
    b->y = (char)ymax - b->bm[1];
  }
  uVar15 = -dx;
  if (0 < dx) {
    uVar15 = dx;
  }
  cVar12 = b->x;
  if (xmin + 1 != (int)cVar12) {
    uVar15 = dx;
  }
  pbVar4 = b->bm;
  cVar13 = -(char)uVar15;
  if (0 < (int)uVar15) {
    cVar13 = (char)uVar15;
  }
  cVar3 = b->y;
  uVar14 = -dy;
  if (0 < dy) {
    uVar14 = dy;
  }
  if (ymin + 1 != (int)cVar3) {
    uVar14 = dy;
  }
  cVar20 = -(char)uVar14;
  if (0 < (int)uVar14) {
    cVar20 = (char)uVar14;
  }
  uVar19 = (uint)(byte)-cVar13;
  if ((uint)*pbVar4 + (int)cVar12 != xmax) {
    uVar19 = uVar15;
  }
  cVar12 = cVar12 + (char)uVar19;
  bVar24 = (uint)pbVar4[1] + (int)cVar3 != ymax;
  b->x = cVar12;
  uVar15 = (uint)(byte)-cVar20;
  if (bVar24) {
    uVar15 = uVar14;
  }
  b->y = cVar3 + (char)uVar15;
  if (*pbVar4 != 0) {
    lVar23 = (long)cVar12;
    local_68 = &lev->locations[lVar23][0].field_0x6;
    uVar14 = 0;
    do {
      puVar11 = b->bm;
      if (puVar11[1] != '\0') {
        cVar12 = b->y;
        lVar10 = (long)(int)cVar12 * 0xc;
        uVar21 = 0;
        puVar22 = local_68;
        do {
          if ((1 << ((byte)uVar14 & 0x1f) & (uint)puVar11[uVar21 + 2]) != 0) {
            puVar22[lVar10 + -2] = 0x25;
            puVar22[lVar10 + 1] = puVar22[lVar10 + 1] | 4;
            unblock_point((int)lVar23,(int)uVar21 + (int)cVar12);
          }
          uVar21 = uVar21 + 1;
          puVar11 = b->bm;
          puVar22 = puVar22 + 0xc;
        } while (uVar21 < puVar11[1]);
      }
      uVar14 = uVar14 + 1;
      lVar23 = lVar23 + 1;
      local_68 = local_68 + 0xfc;
    } while (uVar14 < *b->bm);
  }
  __ptr = b->cons;
  while (__ptr != (container *)0x0) {
    pcVar5 = __ptr->next;
    cVar12 = __ptr->x + (char)uVar19;
    __ptr->x = cVar12;
    cVar13 = __ptr->y + (char)uVar15;
    __ptr->y = cVar13;
    switch(__ptr->what) {
    case 0:
      otmp = (obj *)__ptr->list;
      while (otmp != (obj *)0x0) {
        poVar6 = (otmp->v).v_nexthere;
        place_object(otmp,lev,(int)__ptr->x,(int)__ptr->y);
        otmp = poVar6;
      }
      break;
    case 1:
      mnearto((monst *)__ptr->list,cVar12,cVar13,'\x01');
      break;
    case 2:
      x = (int)u.ux;
      iVar17 = (int)u.uy;
      u.ux = cVar12;
      u.uy = cVar13;
      newsym(x,iVar17);
      mtmp = lev->monsters[__ptr->x][__ptr->y];
      if ((mtmp != (monst *)0x0) && ((mtmp->field_0x61 & 2) == 0)) {
        mnexto(mtmp);
      }
      break;
    case 3:
      pvVar7 = __ptr->list;
      *(char *)((long)pvVar7 + 9) = cVar12;
      *(char *)((long)pvVar7 + 10) = cVar13;
      break;
    default:
      impossible("mv_bubble: unknown bubble contents");
    }
    free(__ptr);
    __ptr = pcVar5;
  }
  b->cons = (container *)0x0;
  (*(code *)(&DAT_002b52b8 +
            *(int *)(&DAT_002b52b8 +
                    (ulong)((uint)(bVar9 || cVar2 <= iVar18) + (uint)(bVar8 || iVar16 <= iVar1) * 2)
                    * 4)))();
  return;
}

Assistant:

static void mv_bubble(struct level *lev, struct bubble *b, int dx, int dy, boolean ini)
{
	int x, y, i, j, colli = 0;
	struct container *cons, *ctemp;

	/* move bubble */
	if (dx < -1 || dx > 1 || dy < -1 || dy > 1) {
	    /* pline("mv_bubble: dx = %d, dy = %d", dx, dy); */
	    dx = sgn(dx);
	    dy = sgn(dy);
	}

	/*
	 * collision with level borders?
	 *	1 = horizontal border, 2 = vertical, 3 = corner
	 */
	if (b->x <= bxmin) colli |= 2;
	if (b->y <= bymin) colli |= 1;
	if ((int) (b->x + b->bm[0] - 1) >= bxmax) colli |= 2;
	if ((int) (b->y + b->bm[1] - 1) >= bymax) colli |= 1;

	if (b->x < bxmin) {
	    pline("bubble xmin: x = %d, xmin = %d", b->x, bxmin);
	    b->x = bxmin;
	}
	if (b->y < bymin) {
	    pline("bubble ymin: y = %d, ymin = %d", b->y, bymin);
	    b->y = bymin;
	}
	if ((int) (b->x + b->bm[0] - 1) > bxmax) {
	    pline("bubble xmax: x = %d, xmax = %d",
			b->x + b->bm[0] - 1, bxmax);
	    b->x = bxmax - b->bm[0] + 1;
	}
	if ((int) (b->y + b->bm[1] - 1) > bymax) {
	    pline("bubble ymax: y = %d, ymax = %d",
			b->y + b->bm[1] - 1, bymax);
	    b->y = bymax - b->bm[1] + 1;
	}

	/* bounce if we're trying to move off the border */
	if (b->x == bxmin && dx < 0) dx = -dx;
	if (b->x + b->bm[0] - 1 == bxmax && dx > 0) dx = -dx;
	if (b->y == bymin && dy < 0) dy = -dy;
	if (b->y + b->bm[1] - 1 == bymax && dy > 0) dy = -dy;

	b->x += dx;
	b->y += dy;

	/* void positions inside bubble */

	for (i = 0, x = b->x; i < (int) b->bm[0]; i++, x++)
	    for (j = 0, y = b->y; j < (int) b->bm[1]; j++, y++)
		if (b->bm[j + 2] & (1 << i)) {
		    lev->locations[x][y].typ = AIR;
		    lev->locations[x][y].lit = 1;
		    unblock_point(x,y);
		}

	/* replace contents of bubble */
	for (cons = b->cons; cons; cons = ctemp) {
	    ctemp = cons->next;
	    cons->x += dx;
	    cons->y += dy;

	    switch(cons->what) {
		case CONS_OBJ: {
		    struct obj *olist, *otmp;

		    for (olist=(struct obj *)cons->list; olist; olist=otmp) {
			otmp = olist->nexthere;
			place_object(olist, lev, cons->x, cons->y);
		    }
		    break;
		}

		case CONS_MON: {
		    struct monst *mon = (struct monst *) cons->list;
		    mnearto(mon, cons->x, cons->y, TRUE);
		    break;
		}

		case CONS_HERO: {
		    int ux0 = u.ux, uy0 = u.uy;

		    /* change u.ux0 and u.uy0? */
		    u.ux = cons->x;
		    u.uy = cons->y;
		    newsym(ux0, uy0);	/* clean up old position */

		    if (MON_AT(lev, cons->x, cons->y)) {
				mnexto(m_at(lev, cons->x,cons->y));
			}
		    break;
		}

		case CONS_TRAP: {
		    struct trap *btrap = (struct trap *) cons->list;
		    btrap->tx = cons->x;
		    btrap->ty = cons->y;
		    break;
		}

		default:
		    impossible("mv_bubble: unknown bubble contents");
		    break;
	    }
	    free(cons);
	}
	b->cons = 0;

	/* boing? */

	switch (colli) {
	    case 1: b->dy = -b->dy;	break;
	    case 3: b->dy = -b->dy;	/* fall through */
	    case 2: b->dx = -b->dx;	break;
	    default:
		/* sometimes alter direction for fun anyway
		   (higher probability for stationary bubbles) */
		if (!ini && ((b->dx || b->dy) ? !rn2(20) : !rn2(5))) {
			b->dx = 1 - rn2(3);
			b->dy = 1 - rn2(3);
		}
	}
}